

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O2

void __thiscall absl::lts_20240722::Mutex::UnlockSlow(Mutex *this,SynchWaitParams *waitp)

{
  SynchWaitParams *pSVar1;
  Condition *pCVar2;
  byte bVar3;
  bool bVar4;
  int c;
  PerThreadSynch *pPVar5;
  PerThreadSynch *pPVar6;
  int64_t iVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  PerThreadSynch *pPVar11;
  long lVar12;
  bool bVar13;
  ulong uStack_60;
  PerThreadSynch *local_58;
  PerThreadSynch *local_50;
  ulong local_48;
  PerThreadSynch *local_40;
  PerThreadSynch *local_38;
  
  uVar10 = (this->mu_).super___atomic_base<long>._M_i;
  AssertReaderHeld(this);
  CheckForMutexCorruption(uVar10,"Unlock");
  if ((uVar10 & 0x10) != 0) {
    PostSynchEvent(this,((uVar10 & 8) == 0) + 8);
  }
  local_38 = (PerThreadSynch *)0x1;
  if (((waitp != (SynchWaitParams *)0x0) && (waitp->thread->waitp != (SynchWaitParams *)0x0)) &&
     (waitp->thread->suppress_fatal_errors != true)) {
    absl::lts_20240722::raw_log_internal::RawLog
              (kFatal,"mutex.cc",0x847,"Check %s failed: %s",
               "waitp == nullptr || waitp->thread->waitp == nullptr || waitp->thread->suppress_fatal_errors"
               ,"detected illegal recursion into Mutex code");
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O2/_deps/absl-src/absl/synchronization/mutex.cc"
                  ,0x847,"void absl::Mutex::UnlockSlow(SynchWaitParams *)");
  }
  uStack_60 = 0;
  local_50 = (PerThreadSynch *)0x0;
  local_58 = (PerThreadSynch *)0x0;
  c = 0;
  local_40 = (PerThreadSynch *)0x0;
  pPVar11 = local_50;
LAB_00107a3a:
  do {
    local_50 = pPVar11;
    uVar10 = (this->mu_).super___atomic_base<long>._M_i;
    uVar9 = (uint)uVar10;
    if (((uVar10 & 8) != 0) && ((uVar9 & 6) != 4 && waitp == (SynchWaitParams *)0x0)) {
      uVar8 = uVar10 & 0xffffffffffffffd7;
LAB_00107a8a:
      LOCK();
      bVar13 = uVar10 == (this->mu_).super___atomic_base<long>._M_i;
      if (bVar13) {
        (this->mu_).super___atomic_base<long>._M_i = uVar8;
      }
      UNLOCK();
      if (bVar13) {
        return;
      }
LAB_00107ab0:
      c = synchronization_internal::MutexDelay(c,0);
      pPVar11 = local_50;
      goto LAB_00107a3a;
    }
    if ((uVar9 & 5) == 1 && waitp == (SynchWaitParams *)0x0) {
      bVar13 = ExactlyOneReader(uVar10);
      uVar8 = (uVar10 - bVar13) - 0x100;
      goto LAB_00107a8a;
    }
    if ((uVar10 & 0x40) != 0) goto LAB_00107ab0;
    LOCK();
    bVar13 = uVar10 == (this->mu_).super___atomic_base<long>._M_i;
    if (bVar13) {
      (this->mu_).super___atomic_base<long>._M_i = uVar10 | 0x40;
    }
    UNLOCK();
    if (!bVar13) goto LAB_00107ab0;
    if ((uVar10 & 4) == 0) {
      if (waitp == (SynchWaitParams *)0x0) {
        absl::lts_20240722::raw_log_internal::RawLog
                  (kFatal,"mutex.cc",0x864,"Check %s failed: %s","waitp != nullptr",
                   "UnlockSlow is confused");
        __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O2/_deps/absl-src/absl/synchronization/mutex.cc"
                      ,0x864,"void absl::Mutex::UnlockSlow(SynchWaitParams *)");
      }
      bVar13 = true;
      do {
        pPVar11 = (PerThreadSynch *)(this->mu_).super___atomic_base<long>._M_i;
        pPVar6 = pPVar11 + -4;
        if ((long)pPVar11 < 0x100) {
          pPVar6 = pPVar11;
        }
        if (bVar13) {
          bVar13 = waitp->cv_word == (atomic<long> *)0x0;
          local_50 = (PerThreadSynch *)0x0;
          pPVar5 = Enqueue((PerThreadSynch *)0x0,waitp,(intptr_t)pPVar6,2);
        }
        else {
          pPVar5 = (PerThreadSynch *)0x0;
          bVar13 = false;
        }
        uVar9 = 0xffffffd7;
        if (((ulong)pPVar11 & 8) == 0) {
          local_50 = pPVar11;
          bVar4 = ExactlyOneReader((intptr_t)pPVar11);
          uVar9 = 0xffffffd7;
          if (bVar4) {
            uVar9 = 0xffffffde;
          }
        }
        uVar10 = (ulong)pPVar6 & 0xffffffffffffff00;
        if (pPVar5 != (PerThreadSynch *)0x0) {
          uVar10 = (ulong)pPVar5 | 4;
        }
        LOCK();
        bVar4 = pPVar11 == (PerThreadSynch *)(this->mu_).super___atomic_base<long>._M_i;
        if (bVar4) {
          (this->mu_).super___atomic_base<long>._M_i = uVar10 | uVar9 & (uint)pPVar11 & 0x9f;
        }
        UNLOCK();
      } while (!bVar4);
      goto LAB_00107ed2;
    }
    pPVar11 = (PerThreadSynch *)(uVar10 & 0xffffffffffffff00);
    if (((uVar10 & 1) != 0) && (0x100 < (long)(pPVar11->readers & 0xffffffffffffff00U))) {
      pPVar11->readers = pPVar11->readers - 0x100;
      if (waitp != (SynchWaitParams *)0x0) {
        pPVar6 = Enqueue(pPVar11,waitp,uVar10,2);
        if (pPVar6 == (PerThreadSynch *)0x0) {
          absl::lts_20240722::raw_log_internal::RawLog
                    (kFatal,"mutex.cc",0x890,"Check %s failed: %s","new_h != nullptr",
                     "waiters disappeared during Enqueue()!");
          __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O2/_deps/absl-src/absl/synchronization/mutex.cc"
                        ,0x890,"void absl::Mutex::UnlockSlow(SynchWaitParams *)");
        }
        uVar9 = uVar9 & 0xbf;
LAB_00107de8:
        uVar10 = (ulong)uVar9 | (ulong)pPVar6;
        local_50 = pPVar11;
      }
      goto LAB_00107ecf;
    }
    pPVar6 = local_50;
    if (local_50 != (PerThreadSynch *)0x0) {
      if (pPVar11->maybe_unlocking == false) {
        absl::lts_20240722::raw_log_internal::RawLog
                  (kFatal,"mutex.cc",0x89c,"Check %s failed: %s",
                   "old_h == nullptr || h->maybe_unlocking","Mutex queue changed beneath us");
        __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O2/_deps/absl-src/absl/synchronization/mutex.cc"
                      ,0x89c,"void absl::Mutex::UnlockSlow(SynchWaitParams *)");
      }
      if (local_50->may_skip == false) {
        local_50->may_skip = true;
        if (local_50->skip != (PerThreadSynch *)0x0) {
          absl::lts_20240722::raw_log_internal::RawLog
                    (kFatal,"mutex.cc",0x8a2,"Check %s failed: %s","old_h->skip == nullptr",
                     "illegal skip from head");
          __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O2/_deps/absl-src/absl/synchronization/mutex.cc"
                        ,0x8a2,"void absl::Mutex::UnlockSlow(SynchWaitParams *)");
        }
        if (local_50 != pPVar11) {
          pPVar5 = local_50->next;
          bVar13 = MuEquivalentWaiter(local_50,pPVar5);
          if (bVar13) {
            local_50->skip = pPVar5;
          }
        }
      }
    }
    pSVar1 = pPVar11->next->waitp;
    if ((pSVar1->how == (MuHow)kExclusiveS) && (pSVar1->cond == (Condition *)0x0)) {
      pPVar11->next->wake = true;
      local_48 = 0x20;
      local_40 = pPVar11;
LAB_00107dff:
      pPVar6 = (PerThreadSynch *)&stack0xffffffffffffffc8;
      bVar3 = 0;
      local_50 = pPVar11;
      break;
    }
    local_48 = uStack_60;
    if ((local_58 != (PerThreadSynch *)0x0) &&
       ((local_58->waitp->how == (MuHow)kExclusiveS || (local_50 == pPVar11)))) {
      if (local_40 == (PerThreadSynch *)0x0) {
        local_40 = pPVar11;
      }
      if (local_40->next != local_58) {
        absl::lts_20240722::raw_log_internal::RawLog
                  (kFatal,"mutex.cc",0x91b,"Check %s failed: %s","pw->next == w",
                   "pw not w\'s predecessor");
        __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O2/_deps/absl-src/absl/synchronization/mutex.cc"
                      ,0x91b,"void absl::Mutex::UnlockSlow(SynchWaitParams *)");
      }
      goto LAB_00107dff;
    }
    if (local_50 == pPVar11) {
      pPVar11->readers = 0;
      pPVar11->maybe_unlocking = false;
      if (waitp != (SynchWaitParams *)0x0) {
        pPVar6 = Enqueue(pPVar11,waitp,uVar10,2);
        uVar9 = uVar9 & 0x96;
        goto LAB_00107de8;
      }
      uVar10 = uVar10 & 0xffffffffffffff96;
      local_50 = pPVar6;
      goto LAB_00107ecf;
    }
    pPVar6 = local_50;
    if (local_50 == (PerThreadSynch *)0x0) {
      pPVar6 = pPVar11;
    }
    pPVar6 = pPVar6->next;
    pPVar11->may_skip = false;
    if (pPVar11->skip != (PerThreadSynch *)0x0) {
      absl::lts_20240722::raw_log_internal::RawLog
                (kFatal,"mutex.cc",0x8e2,"Check %s failed: %s","h->skip == nullptr",
                 "illegal skip from head");
      __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O2/_deps/absl-src/absl/synchronization/mutex.cc"
                    ,0x8e2,"void absl::Mutex::UnlockSlow(SynchWaitParams *)");
    }
    pPVar11->maybe_unlocking = true;
    (this->mu_).super___atomic_base<long>._M_i = uVar10;
    while (uStack_60 = local_48, local_50 != pPVar11) {
      pPVar6->wake = false;
      pCVar2 = pPVar6->waitp->cond;
      if ((pCVar2 == (Condition *)0x0) || (bVar13 = (*pCVar2->eval_)(pCVar2), bVar13)) {
        if (local_58 == (PerThreadSynch *)0x0) {
          pPVar6->wake = true;
          local_58 = pPVar6;
          local_40 = local_50;
          if (pPVar6->waitp->how == (MuHow)kExclusiveS) {
            uStack_60 = 0x20;
            break;
          }
        }
        else if (pPVar6->waitp->how == (MuHow)kSharedS) {
          pPVar6->wake = true;
        }
        else {
          local_48 = 0x20;
        }
      }
      local_50 = pPVar6;
      if (pPVar6->wake == false) {
        local_50 = Skip(pPVar6);
      }
      if (local_50 != pPVar11) {
        pPVar6 = local_50->next;
      }
    }
  } while( true );
  do {
    pPVar5 = local_40->next;
    if (pPVar5->wake == true) {
      if (local_40->skip != (PerThreadSynch *)0x0) {
        absl::lts_20240722::raw_log_internal::RawLog
                  (kFatal,"mutex.cc",0x43c,"Check %s failed: %s","pw->skip == nullptr",
                   "bad skip in DequeueAllWakeable");
        __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O2/_deps/absl-src/absl/synchronization/mutex.cc"
                      ,0x43c,
                      "PerThreadSynch *absl::DequeueAllWakeable(PerThreadSynch *, PerThreadSynch *, PerThreadSynch **)"
                     );
      }
      local_50 = Dequeue(local_50,local_40);
      pPVar5->next = pPVar6->next;
      pPVar6->next = pPVar5;
      if ((local_50 != pPVar11) || (pPVar6 = pPVar5, pPVar5->waitp->how == (MuHow)kExclusiveS))
      break;
    }
    else {
      local_40 = Skip(pPVar5);
      bVar3 = 1;
    }
  } while (!(bool)(local_40 == local_50 & bVar3));
  if (waitp != (SynchWaitParams *)0x0) {
    local_50 = Enqueue(local_50,waitp,uVar10,2);
  }
  if (local_38 == (PerThreadSynch *)0x1) {
    absl::lts_20240722::raw_log_internal::RawLog
              (kFatal,"mutex.cc",0x932,"Check %s failed: %s","wake_list != kPerThreadSynchNull",
               "unexpected empty wake list");
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O2/_deps/absl-src/absl/synchronization/mutex.cc"
                  ,0x932,"void absl::Mutex::UnlockSlow(SynchWaitParams *)");
  }
  if (local_50 == (PerThreadSynch *)0x0) {
    uVar10 = (ulong)(uVar9 & 0x10) | 2;
  }
  else {
    local_50->readers = 0;
    local_50->maybe_unlocking = false;
    uVar10 = local_48 | (ulong)local_50 | (ulong)(uVar9 & 0x10) | 6;
  }
LAB_00107ecf:
  (this->mu_).super___atomic_base<long>._M_i = uVar10;
LAB_00107ed2:
  pPVar11 = local_38;
  if (local_38 != (PerThreadSynch *)0x1) {
    lVar12 = 0;
    iVar7 = base_internal::CycleClock::Now();
    do {
      if (pPVar11->cond_waiter == false) {
        pSVar1 = pPVar11->waitp;
        lVar12 = lVar12 + (iVar7 - pSVar1->contention_start_cycles);
        pSVar1->contention_start_cycles = iVar7;
        pSVar1->should_submit_contention_data = true;
      }
      pPVar11 = Wakeup((Mutex *)local_50,pPVar11);
    } while (pPVar11 != (PerThreadSynch *)0x1);
    if (0 < lVar12) {
      local_38 = pPVar11;
      (*(code *)(anonymous_namespace)::mutex_tracer)("slow release",this,lVar12);
      (*(code *)(anonymous_namespace)::submit_profile_data)(lVar12);
      return;
    }
  }
  return;
}

Assistant:

ABSL_ATTRIBUTE_NOINLINE void Mutex::UnlockSlow(SynchWaitParams* waitp) {
  SchedulingGuard::ScopedDisable disable_rescheduling;
  intptr_t v = mu_.load(std::memory_order_relaxed);
  this->AssertReaderHeld();
  CheckForMutexCorruption(v, "Unlock");
  if ((v & kMuEvent) != 0) {
    PostSynchEvent(
        this, (v & kMuWriter) != 0 ? SYNCH_EV_UNLOCK : SYNCH_EV_READERUNLOCK);
  }
  int c = 0;
  // the waiter under consideration to wake, or zero
  PerThreadSynch* w = nullptr;
  // the predecessor to w or zero
  PerThreadSynch* pw = nullptr;
  // head of the list searched previously, or zero
  PerThreadSynch* old_h = nullptr;
  // a condition that's known to be false.
  PerThreadSynch* wake_list = kPerThreadSynchNull;  // list of threads to wake
  intptr_t wr_wait = 0;  // set to kMuWrWait if we wake a reader and a
                         // later writer could have acquired the lock
                         // (starvation avoidance)
  ABSL_RAW_CHECK(waitp == nullptr || waitp->thread->waitp == nullptr ||
                     waitp->thread->suppress_fatal_errors,
                 "detected illegal recursion into Mutex code");
  // This loop finds threads wake_list to wakeup if any, and removes them from
  // the list of waiters.  In addition, it places waitp.thread on the queue of
  // waiters if waitp is non-zero.
  for (;;) {
    v = mu_.load(std::memory_order_relaxed);
    if ((v & kMuWriter) != 0 && (v & (kMuWait | kMuDesig)) != kMuWait &&
        waitp == nullptr) {
      // fast writer release (writer with no waiters or with designated waker)
      if (mu_.compare_exchange_strong(v, v & ~(kMuWrWait | kMuWriter),
                                      std::memory_order_release,
                                      std::memory_order_relaxed)) {
        return;
      }
    } else if ((v & (kMuReader | kMuWait)) == kMuReader && waitp == nullptr) {
      // fast reader release (reader with no waiters)
      intptr_t clear = ExactlyOneReader(v) ? kMuReader | kMuOne : kMuOne;
      if (mu_.compare_exchange_strong(v, v - clear, std::memory_order_release,
                                      std::memory_order_relaxed)) {
        return;
      }
    } else if ((v & kMuSpin) == 0 &&  // attempt to get spinlock
               mu_.compare_exchange_strong(v, v | kMuSpin,
                                           std::memory_order_acquire,
                                           std::memory_order_relaxed)) {
      if ((v & kMuWait) == 0) {  // no one to wake
        intptr_t nv;
        bool do_enqueue = true;  // always Enqueue() the first time
        ABSL_RAW_CHECK(waitp != nullptr,
                       "UnlockSlow is confused");  // about to sleep
        do {  // must loop to release spinlock as reader count may change
          v = mu_.load(std::memory_order_relaxed);
          // decrement reader count if there are readers
          intptr_t new_readers = (v >= kMuOne) ? v - kMuOne : v;
          PerThreadSynch* new_h = nullptr;
          if (do_enqueue) {
            // If we are enqueuing on a CondVar (waitp->cv_word != nullptr) then
            // we must not retry here.  The initial attempt will always have
            // succeeded, further attempts would enqueue us against *this due to
            // Fer() handling.
            do_enqueue = (waitp->cv_word == nullptr);
            new_h = Enqueue(nullptr, waitp, new_readers, kMuIsCond);
          }
          intptr_t clear = kMuWrWait | kMuWriter;  // by default clear write bit
          if ((v & kMuWriter) == 0 && ExactlyOneReader(v)) {  // last reader
            clear = kMuWrWait | kMuReader;                    // clear read bit
          }
          nv = (v & kMuLow & ~clear & ~kMuSpin);
          if (new_h != nullptr) {
            nv |= kMuWait | reinterpret_cast<intptr_t>(new_h);
          } else {  // new_h could be nullptr if we queued ourselves on a
                    // CondVar
            // In that case, we must place the reader count back in the mutex
            // word, as Enqueue() did not store it in the new waiter.
            nv |= new_readers & kMuHigh;
          }
          // release spinlock & our lock; retry if reader-count changed
          // (writer count cannot change since we hold lock)
        } while (!mu_.compare_exchange_weak(v, nv, std::memory_order_release,
                                            std::memory_order_relaxed));
        break;
      }

      // There are waiters.
      // Set h to the head of the circular waiter list.
      PerThreadSynch* h = GetPerThreadSynch(v);
      if ((v & kMuReader) != 0 && (h->readers & kMuHigh) > kMuOne) {
        // a reader but not the last
        h->readers -= kMuOne;    // release our lock
        intptr_t nv = v;         // normally just release spinlock
        if (waitp != nullptr) {  // but waitp!=nullptr => must queue ourselves
          PerThreadSynch* new_h = Enqueue(h, waitp, v, kMuIsCond);
          ABSL_RAW_CHECK(new_h != nullptr,
                         "waiters disappeared during Enqueue()!");
          nv &= kMuLow;
          nv |= kMuWait | reinterpret_cast<intptr_t>(new_h);
        }
        mu_.store(nv, std::memory_order_release);  // release spinlock
        // can release with a store because there were waiters
        break;
      }

      // Either we didn't search before, or we marked the queue
      // as "maybe_unlocking" and no one else should have changed it.
      ABSL_RAW_CHECK(old_h == nullptr || h->maybe_unlocking,
                     "Mutex queue changed beneath us");

      // The lock is becoming free, and there's a waiter
      if (old_h != nullptr &&
          !old_h->may_skip) {    // we used old_h as a terminator
        old_h->may_skip = true;  // allow old_h to skip once more
        ABSL_RAW_CHECK(old_h->skip == nullptr, "illegal skip from head");
        if (h != old_h && MuEquivalentWaiter(old_h, old_h->next)) {
          old_h->skip = old_h->next;  // old_h not head & can skip to successor
        }
      }
      if (h->next->waitp->how == kExclusive &&
          h->next->waitp->cond == nullptr) {
        // easy case: writer with no condition; no need to search
        pw = h;  // wake w, the successor of h (=pw)
        w = h->next;
        w->wake = true;
        // We are waking up a writer.  This writer may be racing against
        // an already awake reader for the lock.  We want the
        // writer to usually win this race,
        // because if it doesn't, we can potentially keep taking a reader
        // perpetually and writers will starve.  Worse than
        // that, this can also starve other readers if kMuWrWait gets set
        // later.
        wr_wait = kMuWrWait;
      } else if (w != nullptr && (w->waitp->how == kExclusive || h == old_h)) {
        // we found a waiter w to wake on a previous iteration and either it's
        // a writer, or we've searched the entire list so we have all the
        // readers.
        if (pw == nullptr) {  // if w's predecessor is unknown, it must be h
          pw = h;
        }
      } else {
        // At this point we don't know all the waiters to wake, and the first
        // waiter has a condition or is a reader.  We avoid searching over
        // waiters we've searched on previous iterations by starting at
        // old_h if it's set.  If old_h==h, there's no one to wakeup at all.
        if (old_h == h) {  // we've searched before, and nothing's new
                           // so there's no one to wake.
          intptr_t nv = (v & ~(kMuReader | kMuWriter | kMuWrWait));
          h->readers = 0;
          h->maybe_unlocking = false;  // finished unlocking
          if (waitp != nullptr) {      // we must queue ourselves and sleep
            PerThreadSynch* new_h = Enqueue(h, waitp, v, kMuIsCond);
            nv &= kMuLow;
            if (new_h != nullptr) {
              nv |= kMuWait | reinterpret_cast<intptr_t>(new_h);
            }  // else new_h could be nullptr if we queued ourselves on a
               // CondVar
          }
          // release spinlock & lock
          // can release with a store because there were waiters
          mu_.store(nv, std::memory_order_release);
          break;
        }

        // set up to walk the list
        PerThreadSynch* w_walk;   // current waiter during list walk
        PerThreadSynch* pw_walk;  // previous waiter during list walk
        if (old_h != nullptr) {  // we've searched up to old_h before
          pw_walk = old_h;
          w_walk = old_h->next;
        } else {  // no prior search, start at beginning
          pw_walk =
              nullptr;  // h->next's predecessor may change; don't record it
          w_walk = h->next;
        }

        h->may_skip = false;  // ensure we never skip past h in future searches
                              // even if other waiters are queued after it.
        ABSL_RAW_CHECK(h->skip == nullptr, "illegal skip from head");

        h->maybe_unlocking = true;  // we're about to scan the waiter list
                                    // without the spinlock held.
                                    // Enqueue must be conservative about
                                    // priority queuing.

        // We must release the spinlock to evaluate the conditions.
        mu_.store(v, std::memory_order_release);  // release just spinlock
        // can release with a store because there were waiters

        // h is the last waiter queued, and w_walk the first unsearched waiter.
        // Without the spinlock, the locations mu_ and h->next may now change
        // underneath us, but since we hold the lock itself, the only legal
        // change is to add waiters between h and w_walk.  Therefore, it's safe
        // to walk the path from w_walk to h inclusive. (TryRemove() can remove
        // a waiter anywhere, but it acquires both the spinlock and the Mutex)

        old_h = h;  // remember we searched to here

        // Walk the path upto and including h looking for waiters we can wake.
        while (pw_walk != h) {
          w_walk->wake = false;
          if (w_walk->waitp->cond ==
                  nullptr ||  // no condition => vacuously true OR
                              // this thread's condition is true
              EvalConditionIgnored(this, w_walk->waitp->cond)) {
            if (w == nullptr) {
              w_walk->wake = true;  // can wake this waiter
              w = w_walk;
              pw = pw_walk;
              if (w_walk->waitp->how == kExclusive) {
                wr_wait = kMuWrWait;
                break;  // bail if waking this writer
              }
            } else if (w_walk->waitp->how == kShared) {  // wake if a reader
              w_walk->wake = true;
            } else {  // writer with true condition
              wr_wait = kMuWrWait;
            }
          }
          if (w_walk->wake) {  // we're waking reader w_walk
            pw_walk = w_walk;  // don't skip similar waiters
          } else {             // not waking; skip as much as possible
            pw_walk = Skip(w_walk);
          }
          // If pw_walk == h, then load of pw_walk->next can race with
          // concurrent write in Enqueue(). However, at the same time
          // we do not need to do the load, because we will bail out
          // from the loop anyway.
          if (pw_walk != h) {
            w_walk = pw_walk->next;
          }
        }

        continue;  // restart for(;;)-loop to wakeup w or to find more waiters
      }
      ABSL_RAW_CHECK(pw->next == w, "pw not w's predecessor");
      // The first (and perhaps only) waiter we've chosen to wake is w, whose
      // predecessor is pw.  If w is a reader, we must wake all the other
      // waiters with wake==true as well.  We may also need to queue
      // ourselves if waitp != null.  The spinlock and the lock are still
      // held.

      // This traverses the list in [ pw->next, h ], where h is the head,
      // removing all elements with wake==true and placing them in the
      // singly-linked list wake_list.  Returns the new head.
      h = DequeueAllWakeable(h, pw, &wake_list);

      intptr_t nv = (v & kMuEvent) | kMuDesig;
      // assume no waiters left,
      // set kMuDesig for INV1a

      if (waitp != nullptr) {  // we must queue ourselves and sleep
        h = Enqueue(h, waitp, v, kMuIsCond);
        // h is new last waiter; could be null if we queued ourselves on a
        // CondVar
      }

      ABSL_RAW_CHECK(wake_list != kPerThreadSynchNull,
                     "unexpected empty wake list");

      if (h != nullptr) {  // there are waiters left
        h->readers = 0;
        h->maybe_unlocking = false;  // finished unlocking
        nv |= wr_wait | kMuWait | reinterpret_cast<intptr_t>(h);
      }

      // release both spinlock & lock
      // can release with a store because there were waiters
      mu_.store(nv, std::memory_order_release);
      break;  // out of for(;;)-loop
    }
    // aggressive here; no one can proceed till we do
    c = synchronization_internal::MutexDelay(c, AGGRESSIVE);
  }  // end of for(;;)-loop

  if (wake_list != kPerThreadSynchNull) {
    int64_t total_wait_cycles = 0;
    int64_t max_wait_cycles = 0;
    int64_t now = CycleClock::Now();
    do {
      // Profile lock contention events only if the waiter was trying to acquire
      // the lock, not waiting on a condition variable or Condition.
      if (!wake_list->cond_waiter) {
        int64_t cycles_waited =
            (now - wake_list->waitp->contention_start_cycles);
        total_wait_cycles += cycles_waited;
        if (max_wait_cycles == 0) max_wait_cycles = cycles_waited;
        wake_list->waitp->contention_start_cycles = now;
        wake_list->waitp->should_submit_contention_data = true;
      }
      wake_list = Wakeup(wake_list);  // wake waiters
    } while (wake_list != kPerThreadSynchNull);
    if (total_wait_cycles > 0) {
      mutex_tracer("slow release", this, total_wait_cycles);
      ABSL_TSAN_MUTEX_PRE_DIVERT(this, 0);
      submit_profile_data(total_wait_cycles);
      ABSL_TSAN_MUTEX_POST_DIVERT(this, 0);
    }
  }
}